

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O3

HighsStatus __thiscall
FilereaderLp::writeModelToFile
          (FilereaderLp *this,HighsOptions *options,string *filename,HighsModel *model)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  uint uVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  long lVar6;
  pointer pcVar7;
  pointer pdVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  FILE *__stream;
  pointer piVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  HighsSparseMatrix ar_matrix;
  long local_400;
  HighsSparseMatrix local_3c0;
  vector<double,_std::allocator<double>_> *local_350;
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  HighsSparseMatrix local_1c8;
  HighsSparseMatrix local_158;
  HighsSparseMatrix local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_3c0.num_row_ = (model->lp_).a_matrix_.num_row_;
  local_3c0.format_ = (model->lp_).a_matrix_.format_;
  local_3c0.num_col_ = (model->lp_).a_matrix_.num_col_;
  std::vector<int,_std::allocator<int>_>::vector(&local_3c0.start_,&(model->lp_).a_matrix_.start_);
  std::vector<int,_std::allocator<int>_>::vector(&local_3c0.p_end_,&(model->lp_).a_matrix_.p_end_);
  std::vector<int,_std::allocator<int>_>::vector(&local_3c0.index_,&(model->lp_).a_matrix_.index_);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_3c0.value_,&(model->lp_).a_matrix_.value_);
  HighsSparseMatrix::ensureRowwise(&local_3c0);
  __x = &(model->lp_).col_names_;
  pbVar3 = (model->lp_).row_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)(model->lp_).col_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->lp_).col_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  lVar12 = (long)(model->lp_).num_col_;
  pbVar4 = (model->lp_).row_names_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(model->lp_).num_row_;
  __stream = fopen((filename->_M_dataplus)._M_p,"w");
  writeToFile(this,(FILE *)__stream,"\\ %s","File written by HiGHS .lp file handler");
  fputc(10,__stream);
  this->linelength = 0;
  pcVar15 = "max";
  if ((model->lp_).sense_ == kMinimize) {
    pcVar15 = "min";
  }
  writeToFile(this,(FILE *)__stream,"%s",pcVar15);
  fputc(10,__stream);
  this->linelength = 0;
  writeToFile(this,(FILE *)__stream," obj:");
  if (0 < (model->lp_).num_col_) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      dVar21 = (model->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar17];
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        writeToFile(this,(FILE *)__stream," %+.15g");
        if (lVar11 == lVar12) {
          pbVar5 = (__x->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar6 = *(long *)((long)pbVar5 + lVar16 + -8);
          local_1e8[0] = local_1d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e8,lVar6,
                     *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar16) + lVar6);
          writeToFile(this,(FILE *)__stream," %s",local_1e8[0]);
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0]);
          }
        }
        else {
          writeToFile(this,(FILE *)__stream," x%d",(ulong)((int)lVar17 + 1));
        }
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar17 < (model->lp_).num_col_);
  }
  writeToFile(this,(FILE *)__stream," ");
  if ((model->hessian_).dim_ != 0) {
    writeToFile(this,(FILE *)__stream,"+ [");
    iVar10 = (model->lp_).num_col_;
    if (0 < iVar10) {
      piVar14 = (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        lVar16 = (long)piVar14[uVar19];
        uVar20 = uVar19 + 1;
        if (piVar14[uVar19] < piVar14[uVar19 + 1]) {
          do {
            uVar2 = (model->hessian_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar16];
            lVar17 = (long)(int)uVar2;
            if ((long)uVar19 <= lVar17) {
              dVar21 = (model->hessian_).value_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar16];
              if (uVar19 != uVar2) {
                dVar21 = dVar21 + dVar21;
              }
              if ((dVar21 != 0.0) || (NAN(dVar21))) {
                writeToFile(this,(FILE *)__stream," %+.15g");
                if (lVar11 == lVar12) {
                  pbVar5 = (__x->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_268[0] = local_258;
                  pcVar7 = pbVar5[uVar19]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_268,pcVar7,pcVar7 + pbVar5[uVar19]._M_string_length);
                  writeToFile(this,(FILE *)__stream," %s",local_268[0]);
                  if (local_268[0] != local_258) {
                    operator_delete(local_268[0]);
                  }
                  writeToFile(this,(FILE *)__stream," *");
                  pbVar5 = (__x->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_288[0] = local_278;
                  pcVar7 = pbVar5[lVar17]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_288,pcVar7,pcVar7 + pbVar5[lVar17]._M_string_length);
                  writeToFile(this,(FILE *)__stream," %s",local_288[0]);
                  if (local_288[0] != local_278) {
                    operator_delete(local_288[0]);
                  }
                }
                else {
                  writeToFile(this,(FILE *)__stream," x%d",uVar20 & 0xffffffff);
                  writeToFile(this,(FILE *)__stream," *");
                  writeToFile(this,(FILE *)__stream," x%d",(ulong)(uVar2 + 1));
                }
              }
            }
            lVar16 = lVar16 + 1;
            piVar14 = (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start;
          } while (lVar16 < piVar14[uVar20]);
          iVar10 = (model->lp_).num_col_;
        }
        uVar19 = uVar20;
      } while ((long)uVar20 < (long)iVar10);
    }
    writeToFile(this,(FILE *)__stream,"  ]/2 ");
  }
  dVar21 = (model->lp_).offset_;
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    writeToFile(this,(FILE *)__stream," %+.15g");
  }
  fputc(10,__stream);
  this->linelength = 0;
  writeToFile(this,(FILE *)__stream,"st");
  fputc(10,__stream);
  this->linelength = 0;
  if (0 < (model->lp_).num_row_) {
    lVar16 = (long)pbVar3 - (long)pbVar4 >> 5;
    pvVar18 = &(model->lp_).row_lower_;
    pvVar1 = &(model->lp_).row_upper_;
    lVar17 = 0;
    local_400 = 0;
    local_350 = pvVar18;
    do {
      dVar21 = *(double *)
                ((long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
      dVar22 = *(double *)
                ((long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
      iVar10 = (int)local_400;
      if ((dVar21 != dVar22) || (NAN(dVar21) || NAN(dVar22))) {
        if (dVar21 == -INFINITY) {
LAB_001ef713:
          pcVar15 = ":";
        }
        else {
          if (lVar16 == lVar13) {
            pbVar3 = (model->lp_).row_names_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2c8[0] = local_2b8;
            lVar6 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar17 * 4);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2c8,lVar6,
                       *(long *)((long)&pbVar3->_M_string_length + lVar17 * 4) + lVar6);
            writeToFile(this,(FILE *)__stream," %s",local_2c8[0]);
            if (local_2c8[0] != local_2b8) {
              operator_delete(local_2c8[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," con%d",(ulong)(iVar10 + 1));
          }
          pcVar15 = "lo:";
          if (dVar22 == INFINITY) {
            pcVar15 = ":";
          }
          writeToFile(this,(FILE *)__stream,pcVar15);
          local_158.num_row_ = local_3c0.num_row_;
          local_158.format_ = local_3c0.format_;
          local_158.num_col_ = local_3c0.num_col_;
          std::vector<int,_std::allocator<int>_>::vector(&local_158.start_,&local_3c0.start_);
          std::vector<int,_std::allocator<int>_>::vector(&local_158.p_end_,&local_3c0.p_end_);
          std::vector<int,_std::allocator<int>_>::vector(&local_158.index_,&local_3c0.index_);
          std::vector<double,_std::allocator<double>_>::vector(&local_158.value_,&local_3c0.value_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,__x);
          writeToFileMatrixRow(this,(FILE *)__stream,iVar10,&local_158,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if (local_158.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_158.value_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_158.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_158.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_158.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_158.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_158.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_158.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          writeToFile(this,(FILE *)__stream," >=");
          writeToFile(this,(FILE *)__stream," %+.15g",
                      *(undefined8 *)
                       ((long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data._M_start + lVar17));
          fputc(10,__stream);
          bVar9 = dVar22 == INFINITY;
          this->linelength = 0;
          dVar22 = *(double *)
                    ((long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar17);
          pcVar15 = "up:";
          if (bVar9) goto LAB_001ef713;
        }
        if (dVar22 != INFINITY) {
          if (lVar16 == lVar13) {
            pbVar3 = (model->lp_).row_names_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2e8[0] = local_2d8;
            lVar6 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar17 * 4);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2e8,lVar6,
                       *(long *)((long)&pbVar3->_M_string_length + lVar17 * 4) + lVar6);
            writeToFile(this,(FILE *)__stream," %s",local_2e8[0]);
            if (local_2e8[0] != local_2d8) {
              operator_delete(local_2e8[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," con%d",(ulong)(iVar10 + 1));
          }
          writeToFile(this,(FILE *)__stream,pcVar15);
          local_1c8.num_row_ = local_3c0.num_row_;
          local_1c8.format_ = local_3c0.format_;
          local_1c8.num_col_ = local_3c0.num_col_;
          std::vector<int,_std::allocator<int>_>::vector(&local_1c8.start_,&local_3c0.start_);
          std::vector<int,_std::allocator<int>_>::vector(&local_1c8.p_end_,&local_3c0.p_end_);
          std::vector<int,_std::allocator<int>_>::vector(&local_1c8.index_,&local_3c0.index_);
          std::vector<double,_std::allocator<double>_>::vector(&local_1c8.value_,&local_3c0.value_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_60,__x);
          writeToFileMatrixRow(this,(FILE *)__stream,iVar10,&local_1c8,&local_60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          if (local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.value_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_1c8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pcVar15 = " <=";
          pvVar18 = pvVar1;
          piVar14 = local_1c8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_001ef8b3;
        }
      }
      else {
        if (lVar16 == lVar13) {
          pbVar3 = (model->lp_).row_names_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_2a8[0] = local_298;
          lVar6 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar17 * 4);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a8,lVar6,
                     *(long *)((long)&pbVar3->_M_string_length + lVar17 * 4) + lVar6);
          writeToFile(this,(FILE *)__stream," %s",local_2a8[0]);
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0]);
          }
        }
        else {
          writeToFile(this,(FILE *)__stream," con%d",(ulong)(iVar10 + 1));
        }
        writeToFile(this,(FILE *)__stream,":");
        local_e8.num_row_ = local_3c0.num_row_;
        local_e8.format_ = local_3c0.format_;
        local_e8.num_col_ = local_3c0.num_col_;
        std::vector<int,_std::allocator<int>_>::vector(&local_e8.start_,&local_3c0.start_);
        std::vector<int,_std::allocator<int>_>::vector(&local_e8.p_end_,&local_3c0.p_end_);
        std::vector<int,_std::allocator<int>_>::vector(&local_e8.index_,&local_3c0.index_);
        std::vector<double,_std::allocator<double>_>::vector(&local_e8.value_,&local_3c0.value_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_78,__x);
        writeToFileMatrixRow(this,(FILE *)__stream,iVar10,&local_e8,&local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if (local_e8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.value_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_e8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pcVar15 = " =";
        piVar14 = local_e8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_001ef8b3:
        if (piVar14 != (pointer)0x0) {
          operator_delete(piVar14);
        }
        writeToFile(this,(FILE *)__stream,pcVar15);
        writeToFile(this,(FILE *)__stream," %+.15g",
                    *(undefined8 *)
                     ((long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar17));
        fputc(10,__stream);
        this->linelength = 0;
        pvVar18 = local_350;
      }
      local_400 = local_400 + 1;
      lVar17 = lVar17 + 8;
    } while (local_400 < (model->lp_).num_row_);
  }
  writeToFile(this,(FILE *)__stream,"bounds");
  fputc(10,__stream);
  this->linelength = 0;
  iVar10 = (model->lp_).num_col_;
  if (0 < iVar10) {
    lVar16 = 0;
    lVar13 = 0;
    do {
      pdVar8 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar21 = *(double *)
                ((long)(model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar16);
      if (((dVar21 != 0.0) || (NAN(dVar21))) || (*(double *)((long)pdVar8 + lVar16) < INFINITY)) {
        dVar22 = *(double *)((long)pdVar8 + lVar16);
        iVar10 = (int)lVar13;
        if ((-INFINITY < dVar21) || (dVar22 < INFINITY)) {
          if ((dVar21 != dVar22) || (NAN(dVar21) || NAN(dVar22))) {
            if ((dVar21 != 0.0) || (NAN(dVar21))) {
              writeToFile(this,(FILE *)__stream," %.15g");
              writeToFile(this,(FILE *)__stream," <=");
            }
            if (lVar11 == lVar12) {
              pbVar3 = (__x->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_348[0] = local_338;
              lVar17 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar16 * 4);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_348,lVar17,
                         *(long *)((long)&pbVar3->_M_string_length + lVar16 * 4) + lVar17);
              writeToFile(this,(FILE *)__stream," %s",local_348[0]);
              if (local_348[0] != local_338) {
                operator_delete(local_348[0]);
              }
            }
            else {
              writeToFile(this,(FILE *)__stream," x%d",(ulong)(iVar10 + 1));
            }
            if (*(double *)
                 ((long)(model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16) == INFINITY)
            goto LAB_001efc33;
            pcVar15 = " <=";
          }
          else {
            if (lVar11 == lVar12) {
              pbVar3 = (__x->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_328[0] = local_318;
              lVar17 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar16 * 4);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_328,lVar17,
                         *(long *)((long)&pbVar3->_M_string_length + lVar16 * 4) + lVar17);
              writeToFile(this,(FILE *)__stream," %s",local_328[0]);
              if (local_328[0] != local_318) {
                operator_delete(local_328[0]);
              }
            }
            else {
              writeToFile(this,(FILE *)__stream," x%d",(ulong)(iVar10 + 1));
            }
            pcVar15 = " =";
          }
          writeToFile(this,(FILE *)__stream,pcVar15);
          writeToFile(this,(FILE *)__stream," %.15g",
                      *(undefined8 *)
                       ((long)(model->lp_).col_upper_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar16));
        }
        else {
          if (lVar11 == lVar12) {
            pbVar3 = (__x->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_308[0] = local_2f8;
            lVar17 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar16 * 4);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_308,lVar17,
                       *(long *)((long)&pbVar3->_M_string_length + lVar16 * 4) + lVar17);
            writeToFile(this,(FILE *)__stream," %s",local_308[0]);
            if (local_308[0] != local_2f8) {
              operator_delete(local_308[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," x%d",(ulong)(iVar10 + 1));
          }
          writeToFile(this,(FILE *)__stream," free");
        }
LAB_001efc33:
        fputc(10,__stream);
        this->linelength = 0;
        iVar10 = (model->lp_).num_col_;
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar13 < iVar10);
  }
  if ((model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    writeToFile(this,(FILE *)__stream,"bin");
    fputc(10,__stream);
    this->linelength = 0;
    iVar10 = (model->lp_).num_col_;
    if (0 < iVar10) {
      lVar13 = 8;
      lVar16 = 0;
      do {
        if (((((model->lp_).integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16] == kInteger) &&
             (dVar21 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar16], dVar21 == 0.0)) &&
            (!NAN(dVar21))) &&
           ((dVar21 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar16], dVar21 == 1.0 &&
            (!NAN(dVar21))))) {
          if (lVar11 == lVar12) {
            pbVar3 = (__x->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar17 = *(long *)((long)pbVar3 + lVar13 + -8);
            local_208[0] = local_1f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,lVar17,
                       *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar13) + lVar17);
            writeToFile(this,(FILE *)__stream," %s",local_208[0]);
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," x%d",(ulong)((int)lVar16 + 1));
          }
          fputc(10,__stream);
          this->linelength = 0;
          iVar10 = (model->lp_).num_col_;
        }
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar16 < iVar10);
    }
    writeToFile(this,(FILE *)__stream,"gen");
    fputc(10,__stream);
    this->linelength = 0;
    iVar10 = (model->lp_).num_col_;
    if (0 < iVar10) {
      lVar13 = 8;
      lVar16 = 0;
      do {
        if (((model->lp_).integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16] == kInteger) &&
           (((dVar21 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar16], dVar21 != 0.0 ||
             (NAN(dVar21))) ||
            ((dVar21 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar16], dVar21 != 1.0 ||
             (NAN(dVar21))))))) {
          if (lVar11 == lVar12) {
            pbVar3 = (__x->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar17 = *(long *)((long)pbVar3 + lVar13 + -8);
            local_228[0] = local_218;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_228,lVar17,
                       *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar13) + lVar17);
            writeToFile(this,(FILE *)__stream," %s",local_228[0]);
            if (local_228[0] != local_218) {
              operator_delete(local_228[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," x%d",(ulong)((int)lVar16 + 1));
          }
          fputc(10,__stream);
          this->linelength = 0;
          iVar10 = (model->lp_).num_col_;
        }
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar16 < iVar10);
    }
    writeToFile(this,(FILE *)__stream,"semi");
    fputc(10,__stream);
    this->linelength = 0;
    iVar10 = (model->lp_).num_col_;
    if (0 < iVar10) {
      lVar13 = 8;
      lVar16 = 0;
      do {
        if (((model->lp_).integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16] & ~kInteger) == kSemiContinuous) {
          if (lVar11 == lVar12) {
            pbVar3 = (__x->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar17 = *(long *)((long)pbVar3 + lVar13 + -8);
            local_248[0] = local_238;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,lVar17,
                       *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar13) + lVar17);
            writeToFile(this,(FILE *)__stream," %s",local_248[0]);
            if (local_248[0] != local_238) {
              operator_delete(local_248[0]);
            }
          }
          else {
            writeToFile(this,(FILE *)__stream," x%d",(ulong)((int)lVar16 + 1));
          }
          fputc(10,__stream);
          this->linelength = 0;
          iVar10 = (model->lp_).num_col_;
        }
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar16 < iVar10);
    }
  }
  writeToFile(this,(FILE *)__stream,"end");
  fputc(10,__stream);
  this->linelength = 0;
  fclose(__stream);
  if (local_3c0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_3c0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_3c0.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_3c0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus FilereaderLp::writeModelToFile(const HighsOptions& options,
                                           const std::string filename,
                                           const HighsModel& model) {
  const HighsLp& lp = model.lp_;
  // Create a row-wise copy of the matrix
  HighsSparseMatrix ar_matrix = lp.a_matrix_;
  ar_matrix.ensureRowwise();

  const bool has_col_names =
      allow_model_names &&
      lp.col_names_.size() == static_cast<size_t>(lp.num_col_);
  const bool has_row_names =
      allow_model_names &&
      lp.row_names_.size() == static_cast<size_t>(lp.num_row_);
  FILE* file = fopen(filename.c_str(), "w");

  // write comment at the start of the file
  this->writeToFile(file, "\\ %s", LP_COMMENT_FILESTART);
  this->writeToFileLineend(file);

  // write objective
  this->writeToFile(file, "%s",
                    lp.sense_ == ObjSense::kMinimize ? "min" : "max");
  this->writeToFileLineend(file);
  this->writeToFile(file, " obj:");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double coef = lp.col_cost_[iCol];
    if (coef != 0.0) {
      this->writeToFileValue(file, coef);
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
    }
  }
  this->writeToFile(file,
                    " ");  // ToDo Unnecessary, but only to give empty diff
  if (model.isQp()) {
    this->writeToFile(file, "+ [");
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      for (HighsInt iEl = model.hessian_.start_[iCol];
           iEl < model.hessian_.start_[iCol + 1]; iEl++) {
        HighsInt iRow = model.hessian_.index_[iEl];
        if (iCol <= iRow) {
          double coef = model.hessian_.value_[iEl];
          if (iCol != iRow) coef *= 2;
          if (coef != 0.0) {
            this->writeToFileValue(file, coef);
            if (has_col_names) {
              this->writeToFileVar(file, lp.col_names_[iCol]);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, lp.col_names_[iRow]);
            } else {
              this->writeToFileVar(file, iCol);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, iRow);
            }
          }
        }
      }
    }
    this->writeToFile(file,
                      "  ]/2 ");  // ToDo Surely needs only to be one space
  }
  double coef = lp.offset_;
  if (coef != 0) this->writeToFileValue(file, coef);
  this->writeToFileLineend(file);

  // write constraint section, lower & upper bounds are one constraint
  // each
  this->writeToFile(file, "st");
  this->writeToFileLineend(file);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] == lp.row_upper_[iRow]) {
      // Equality constraint
      if (has_row_names) {
        this->writeToFileVar(file, lp.row_names_[iRow]);
      } else {
        this->writeToFileCon(file, iRow);
      }
      this->writeToFile(file, ":");
      this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.row_lower_[iRow], true);
      this->writeToFileLineend(file);
    } else {
      // Need to distinguish the names when writing out boxed
      // constraint row as two single-sided constraints
      const bool boxed =
          lp.row_lower_[iRow] > -kHighsInf && lp.row_upper_[iRow] < kHighsInf;
      if (lp.row_lower_[iRow] > -kHighsInf) {
        // Has a lower bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "lo:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " >=");
        this->writeToFileValue(file, lp.row_lower_[iRow], true);
        this->writeToFileLineend(file);
      }
      if (lp.row_upper_[iRow] < kHighsInf) {
        // Has an upper bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "up:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.row_upper_[iRow], true);
        this->writeToFileLineend(file);
      }
    }
  }

  // write bounds section
  this->writeToFile(file, "bounds");
  this->writeToFileLineend(file);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const bool default_bounds =
        lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == kHighsInf;
    if (default_bounds) continue;
    if (lp.col_lower_[iCol] <= -kHighsInf && lp.col_upper_[iCol] >= kHighsInf) {
      // Free variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " free");
    } else if (lp.col_lower_[iCol] == lp.col_upper_[iCol]) {
      // Fixed variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.col_upper_[iCol], false);
    } else {
      assert(!default_bounds);
      // Non-default bound
      if (lp.col_lower_[iCol] != 0) {
        // Nonzero lower bound
        this->writeToFileValue(file, lp.col_lower_[iCol], false);
        this->writeToFile(file, " <=");
      }
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      if (lp.col_upper_[iCol] < kHighsInf) {
        // Finite upper bound
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.col_upper_[iCol], false);
      }
    }
    this->writeToFileLineend(file);
  }
  if (lp.integrality_.size() > 0) {
    // write binary section
    this->writeToFile(file, "bin");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0.0 && lp.col_upper_[iCol] == 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write general section
    this->writeToFile(file, "gen");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] != 0.0 || lp.col_upper_[iCol] != 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write semi section
    this->writeToFile(file, "semi");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        if (has_col_names) {
          this->writeToFileVar(file, lp.col_names_[iCol]);
        } else {
          this->writeToFileVar(file, iCol);
        }
        this->writeToFileLineend(file);
      }
    }
  }
  // write end
  this->writeToFile(file, "end");
  this->writeToFileLineend(file);

  fclose(file);
  return HighsStatus::kOk;
}